

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::ClientImpl::Post
          (Result *__return_storage_ptr__,ClientImpl *this,string *path,Headers *headers,
          MultipartFormDataItems *items)

{
  MultipartFormDataItems *headers_00;
  Headers *path_00;
  char *__s;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  string *local_98;
  string *body;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string *content_type;
  string *local_38;
  string *boundary;
  MultipartFormDataItems *items_local;
  Headers *headers_local;
  string *path_local;
  ClientImpl *this_local;
  
  boundary = (string *)items;
  items_local = (MultipartFormDataItems *)headers;
  headers_local = (Headers *)path;
  path_local = (string *)this;
  this_local = (ClientImpl *)__return_storage_ptr__;
  detail::make_multipart_data_boundary_abi_cxx11_();
  local_38 = (string *)&content_type;
  detail::serialize_multipart_formdata_get_content_type(&local_80,(string *)&content_type);
  local_60 = &local_80;
  detail::serialize_multipart_formdata(&local_b8,(MultipartFormDataItems *)boundary,local_38,true);
  path_00 = headers_local;
  headers_00 = items_local;
  local_98 = &local_b8;
  __s = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  (local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
  Post(__return_storage_ptr__,this,(string *)path_00,(Headers *)headers_00,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&content_type);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Post(const std::string &path, const Headers &headers,
                               const MultipartFormDataItems &items) {
  const auto &boundary = detail::make_multipart_data_boundary();
  const auto &content_type =
      detail::serialize_multipart_formdata_get_content_type(boundary);
  const auto &body = detail::serialize_multipart_formdata(items, boundary);
  return Post(path, headers, body, content_type.c_str());
}